

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t format_function_key(char *buf,Terminal *term,wchar_t key_number,_Bool shift,_Bool ctrl,
                           _Bool alt,_Bool *consumed_alt)

{
  uint uVar1;
  wchar_t wVar2;
  long lVar3;
  wchar_t local_58;
  wchar_t local_3c;
  wchar_t local_38;
  wchar_t bitmap_1;
  wchar_t bitmap;
  wchar_t offt;
  wchar_t code;
  wchar_t index;
  char *p;
  _Bool alt_local;
  _Bool ctrl_local;
  _Bool shift_local;
  wchar_t key_number_local;
  Terminal *term_local;
  char *buf_local;
  
  if (key_number < L'\x01') {
    __assert_fail("key_number > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1cfb,
                  "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
  }
  if ((uint)key_number < 0x15) {
    offt = key_number;
    p._3_1_ = shift;
    if ((((term->funky_type != L'\x06') && (term->funky_type != L'\x05')) && (shift)) &&
       (key_number < L'\v')) {
      p._3_1_ = false;
      offt = key_number + L'\n';
    }
    lVar3 = (long)offt;
    uVar1 = format_function_key::key_number_to_tilde_code[lVar3];
    if (term->funky_type == L'\x05') {
      if ((key_number < L'\x01') || (L'\f' < key_number)) {
        local_58 = L'\0';
      }
      else {
        local_58 = key_number + L'\xffffffff';
      }
      offt = local_58;
      if (p._3_1_ != false) {
        offt = local_58 + L'\f';
      }
      if (ctrl) {
        offt = offt + L'\x18';
      }
      wVar2 = sprintf(buf,"\x1b[%c",
                      (ulong)(uint)(int)"MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{"[offt],
                      (long)offt,buf,consumed_alt);
    }
    else if ((((term->vt52_mode & 1U) == 0) && (term->funky_type != L'\x04')) ||
            (((int)uVar1 < 0xb || (0x18 < (int)uVar1)))) {
      if (((term->funky_type == L'\x01') && (10 < (int)uVar1)) && ((int)uVar1 < 0x10)) {
        wVar2 = sprintf(buf,"\x1b[[%c",(ulong)(uVar1 + 0x36),lVar3,buf,consumed_alt);
      }
      else if ((((term->funky_type == L'\x02') || (term->funky_type == L'\x06')) &&
               (10 < (int)uVar1)) && ((int)uVar1 < 0xf)) {
        if ((term->vt52_mode & 1U) == 0) {
          local_38 = L'\0';
          if (term->funky_type == L'\x06') {
            local_38 = shift_bitmap(p._3_1_,ctrl,alt,consumed_alt);
          }
          if (local_38 == L'\0') {
            wVar2 = sprintf(buf,"\x1bO%c",(ulong)(uVar1 + 0x45));
          }
          else {
            wVar2 = sprintf(buf,"\x1b[1;%d%c",(ulong)(uint)local_38,(ulong)(uVar1 + 0x45));
          }
        }
        else {
          wVar2 = sprintf(buf,"\x1b%c",(ulong)(uVar1 + 0x45),lVar3,buf,consumed_alt);
        }
      }
      else {
        local_3c = L'\0';
        if (term->funky_type == L'\x06') {
          local_3c = shift_bitmap(p._3_1_,ctrl,alt,consumed_alt);
        }
        if (local_3c == L'\0') {
          wVar2 = sprintf(buf,"\x1b[%d~",(ulong)uVar1);
        }
        else {
          wVar2 = sprintf(buf,"\x1b[%d;%d~",(ulong)uVar1,(ulong)(uint)local_3c);
        }
      }
    }
    else {
      bitmap_1 = (wchar_t)(0xf < (int)uVar1);
      if (0x15 < (int)uVar1) {
        bitmap_1 = bitmap_1 + L'\x01';
      }
      if ((term->vt52_mode & 1U) == 0) {
        wVar2 = sprintf(buf,"\x1bO%c",(ulong)(uint)((uVar1 + 0x45) - bitmap_1),lVar3,buf,
                        consumed_alt);
      }
      else {
        wVar2 = sprintf(buf,"\x1b%c",(ulong)(uint)((uVar1 + 0x45) - bitmap_1),lVar3,buf,consumed_alt
                       );
      }
    }
    return wVar2;
  }
  __assert_fail("key_number < lenof(key_number_to_tilde_code)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                ,0x1cfc,
                "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
}

Assistant:

int format_function_key(char *buf, Terminal *term, int key_number,
                        bool shift, bool ctrl, bool alt, bool *consumed_alt)
{
    char *p = buf;

    static const int key_number_to_tilde_code[] = {
        -1,                 /* no such key as F0 */
        11, 12, 13, 14, 15, /*gap*/ 17, 18, 19, 20, 21, /*gap*/
        23, 24, 25, 26, /*gap*/ 28, 29, /*gap*/ 31, 32, 33, 34,
    };

    assert(key_number > 0);
    assert(key_number < lenof(key_number_to_tilde_code));

    int index = key_number;
    if (term->funky_type != FUNKY_XTERM_216 && term->funky_type != FUNKY_SCO) {
        if (shift && index <= 10) {
            shift = false;
            index += 10;
        }
    }

    int code = key_number_to_tilde_code[index];

    if (term->funky_type == FUNKY_SCO) {
        /* SCO function keys */
        static const char sco_codes[] =
            "MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{";
        index = (key_number >= 1 && key_number <= 12) ? key_number - 1 : 0;
        if (shift) index += 12;
        if (ctrl) index += 24;
        p += sprintf(p, "\x1B[%c", sco_codes[index]);
    } else if ((term->vt52_mode || term->funky_type == FUNKY_VT100P) &&
               code >= 11 && code <= 24) {
        int offt = 0;
        if (code > 15)
            offt++;
        if (code > 21)
            offt++;
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11 - offt);
        else
            p += sprintf(p, "\x1BO%c", code + 'P' - 11 - offt);
    } else if (term->funky_type == FUNKY_LINUX && code >= 11 && code <= 15) {
        p += sprintf(p, "\x1B[[%c", code + 'A' - 11);
    } else if ((term->funky_type == FUNKY_XTERM ||
                term->funky_type == FUNKY_XTERM_216) &&
               code >= 11 && code <= 14) {
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11);
        else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[1;%d%c", bitmap, code + 'P' - 11);
            else
                p += sprintf(p, "\x1BO%c", code + 'P' - 11);
        }
    } else {
        int bitmap = 0;
        if (term->funky_type == FUNKY_XTERM_216)
            bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
        if (bitmap)
            p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
        else
            p += sprintf(p, "\x1B[%d~", code);
    }

    return p - buf;
}